

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  internal *piVar1;
  _Rb_tree_node_base *p_Var2;
  FILE *__stream;
  bool bVar3;
  __type _Var4;
  size_type sVar5;
  _Rb_tree_node_base *p_Var6;
  int line_00;
  ulong uVar7;
  char *extraout_RDX;
  char *pcVar8;
  char *extraout_RDX_00;
  internal *this_00;
  string *name;
  pointer __x;
  ostream *poVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  TypedTestSuitePState *local_108;
  uint local_fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  internal *local_d8;
  char *local_d0;
  string local_c8;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  CodeLocation local_78;
  string local_50;
  
  uVar7 = (ulong)(uint)line;
  local_108 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,file,(allocator<char> *)&local_c8);
  std::__cxx11::string::string((string *)&local_78,(string *)local_a8);
  local_78.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_78);
  local_d8 = (internal *)file;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_a8);
  *local_108 = (TypedTestSuitePState)0x1;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (internal *)(registered_tests + -1);
  do {
    piVar1 = this_00 + 1;
    this_00 = this_00 + 1;
    bVar3 = IsSpace((char)*piVar1);
  } while (bVar3);
  pcVar8 = extraout_RDX;
  while (this_00 != (internal *)0x0) {
    GetPrefixUntilComma_abi_cxx11_(&local_c8,this_00,pcVar8);
    StripTrailingSpaces((string *)local_a8,&local_c8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
               (string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    this_00 = (internal *)SkipComma((char *)this_00);
    pcVar8 = extraout_RDX_00;
  }
  local_fc = line;
  local_d0 = registered_tests;
  Message::Message((Message *)&local_110);
  local_a8._24_8_ = local_a8 + 8;
  local_a8._8_4_ = _S_red;
  local_a8._16_8_ = 0;
  local_80 = 0;
  p_Var2 = (_Rb_tree_node_base *)(local_108 + 0x10);
  __x = local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (_Base_ptr)local_a8._24_8_;
  do {
    if (__x == local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      for (p_Var6 = *(_Rb_tree_node_base **)(local_108 + 0x20); line_00 = (int)uVar7,
          p_Var6 != p_Var2; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        sVar5 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a8,(key_type *)(p_Var6 + 1));
        if (sVar5 == 0) {
          poVar9 = (ostream *)(local_110._M_head_impl + 0x10);
          std::operator<<(poVar9,"You forgot to list test ");
          std::operator<<(poVar9,(string *)(p_Var6 + 1));
          std::operator<<((ostream *)(local_110._M_head_impl + 0x10),".\n");
        }
      }
      StringStreamToString(&local_c8,local_110._M_head_impl);
      bVar3 = std::operator!=(&local_c8,"");
      pcVar8 = local_d0;
      __stream = _stderr;
      if (!bVar3) {
        std::__cxx11::string::~string((string *)&local_c8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
        if (local_110._M_head_impl != (stringstream *)0x0) {
          (**(code **)(*(long *)local_110._M_head_impl + 8))(local_110._M_head_impl);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f8);
        return pcVar8;
      }
      FormatFileLocation_abi_cxx11_(&local_50,local_d8,(char *)(ulong)local_fc,line_00);
      fprintf(__stream,"%s %s",local_50._M_dataplus._M_p,local_c8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      fflush(_stderr);
      posix::Abort();
    }
    sVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8,__x);
    if (sVar5 == 0) {
      for (p_Var6 = *(_Rb_tree_node_base **)(local_108 + 0x20); p_Var6 != p_Var2;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        _Var4 = std::operator==(__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var6 + 1));
        if (_Var4) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a8,__x);
          goto LAB_00127437;
        }
      }
      poVar9 = (ostream *)(local_110._M_head_impl + 0x10);
      std::operator<<(poVar9,"No test named ");
      std::operator<<(poVar9,(string *)__x);
      std::operator<<(poVar9," can be found in this test suite.\n");
    }
    else {
      poVar9 = (ostream *)(local_110._M_head_impl + 0x10);
      std::operator<<(poVar9,"Test ");
      std::operator<<(poVar9,(string *)__x);
      std::operator<<(poVar9," is listed more than once.\n");
    }
LAB_00127437:
    __x = __x + 1;
  } while( true );
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}